

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_while_t::Generate(ast_while_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  int while_loc;
  int pc_local;
  ostream *output_local;
  ast_while_t *this_local;
  
  poVar2 = std::operator<<(output,": __while_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pc);
  poVar2 = std::operator<<(poVar2,"__");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = (*this->condition->_vptr_ast_item_t[2])(this->condition,output,(ulong)(uint)pc);
  poVar2 = std::operator<<(output,"jz __end_while_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pc);
  poVar2 = std::operator<<(poVar2,"__");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  (this->super_ast_loop_t).end_loc_pos = pc;
  iVar1 = ast_t::Generate(this->loop,output,iVar1 + 1);
  poVar2 = std::operator<<(output,"jmp __while_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pc);
  poVar2 = std::operator<<(poVar2,"__");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(output,": __end_while_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pc);
  poVar2 = std::operator<<(poVar2,"__");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return iVar1 + 1;
}

Assistant:

int ast_while_t::Generate(std::ostream& output, int pc) const {

    int while_loc = pc;

    output << ": __while_" << while_loc << "__" << std::endl;
    pc = this->condition->Generate(output, pc);
    output << "jz __end_while_" << while_loc << "__" << std::endl;
    ++pc;

    this->end_loc_pos = while_loc;
    pc = this->loop->Generate(output, pc);
    output << "jmp __while_" << while_loc << "__" << std::endl;
    ++pc;

    output << ": __end_while_" <<while_loc << "__" << std::endl;
    return pc;
  }